

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

optional<google::protobuf::internal::DescriptorNames> __thiscall
google::protobuf::anon_unknown_24::
FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
::CreateDescriptorNames
          (FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
           *this,initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> bytes,
          initializer_list<unsigned_long> sizes)

{
  ulong *puVar1;
  PointerT<char> pcVar2;
  size_t __n;
  int iVar3;
  int iVar4;
  int extraout_EAX;
  Nonnull<const_char_*> pcVar6;
  ulong *puVar7;
  long lVar8;
  size_type sVar9;
  size_type sVar10;
  size_type extraout_RDX;
  undefined8 uVar11;
  size_type extraout_RDX_00;
  iterator pbVar12;
  iterator pbVar13;
  size_type sVar14;
  size_type sVar15;
  _Storage<google::protobuf::internal::DescriptorNames,_true> unaff_R12;
  long unaff_R13;
  bool bVar16;
  optional<google::protobuf::internal::DescriptorNames> oVar17;
  FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
  local_40 [16];
  long lVar5;
  
  sVar9 = bytes._M_len;
  pbVar12 = bytes._M_array;
  sVar14 = sizes._M_len;
  puVar7 = sizes._M_array;
  bVar16 = sVar14 == 0;
  sVar10 = sVar9;
  if (!bVar16) {
    if (*puVar7 < 0x10000) {
      sVar10 = 8;
      do {
        bVar16 = sVar14 * 8 - sVar10 == 0;
        if (bVar16) goto LAB_0022f2c0;
        puVar1 = (ulong *)((long)puVar7 + sVar10);
        sVar10 = sVar10 + 8;
      } while (*puVar1 < 0x10000);
    }
    if (!bVar16) {
      uVar11 = 0;
      goto LAB_0022f367;
    }
  }
LAB_0022f2c0:
  if (sVar9 == 0) {
    iVar3 = 0;
  }
  else {
    lVar8 = 0;
    lVar5 = 0;
    do {
      lVar5 = lVar5 + *(long *)((long)&pbVar12->_M_len + lVar8);
      iVar3 = (int)lVar5;
      lVar8 = lVar8 + 0x10;
    } while (sVar9 * 0x10 != lVar8);
  }
  pcVar2 = (this->pointers_).payload_.super_Base<char>.value;
  sVar15 = sVar9;
  if (pcVar2 == (PointerT<char>)0x0) {
    pbVar13 = pbVar12;
    protobuf::(anonymous_namespace)::
    FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
    ::CreateDescriptorNames(local_40);
    iVar4 = extraout_EAX;
LAB_0022f383:
    pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       ((long)iVar4,(long)pbVar13,"used <= total_.template Get<TypeToUse>()");
    sVar10 = extraout_RDX_00;
  }
  else {
    iVar4 = (this->used_).payload_.super_Base<char>.value;
    unaff_R13 = (long)iVar4;
    iVar4 = (iVar3 + (int)sizes._M_len * 2 + 7U & 0xfffffff8) + iVar4;
    (this->used_).payload_.super_Base<char>.value = iVar4;
    iVar3 = (this->total_).payload_.super_Base<char>.value;
    pbVar13 = (iterator)(long)iVar3;
    if (iVar3 < iVar4) goto LAB_0022f383;
    pcVar6 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar6 != (Nonnull<const_char_*>)0x0) {
    protobuf::(anonymous_namespace)::
    FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
    ::CreateDescriptorNames();
  }
  unaff_R12 = (_Storage<google::protobuf::internal::DescriptorNames,_true>)
              ((long)pcVar2 + unaff_R13);
  if (sVar15 != 0) {
    pbVar13 = pbVar12 + sVar9;
    do {
      __n = pbVar12->_M_len;
      memcpy((void *)unaff_R12,pbVar12->_M_str,__n);
      unaff_R12 = (_Storage<google::protobuf::internal::DescriptorNames,_true>)
                  ((long)unaff_R12 + __n);
      pbVar12 = pbVar12 + 1;
      sVar10 = extraout_RDX;
    } while (pbVar12 != pbVar13);
  }
  uVar11 = CONCAT71((int7)(sVar10 >> 8),1);
  if (sVar14 != 0) {
    lVar8 = sVar14 << 3;
    lVar5 = 0;
    do {
      *(undefined2 *)((long)unaff_R12 + lVar5) = *(undefined2 *)((long)puVar7 + lVar5 * 4);
      lVar5 = lVar5 + 2;
      lVar8 = lVar8 + -8;
    } while (lVar8 != 0);
  }
LAB_0022f367:
  oVar17.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>._M_payload.
  super__Optional_payload_base<google::protobuf::internal::DescriptorNames>._8_8_ = uVar11;
  oVar17.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>._M_payload.
  super__Optional_payload_base<google::protobuf::internal::DescriptorNames>._M_payload = unaff_R12;
  return (optional<google::protobuf::internal::DescriptorNames>)
         oVar17.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>.
         _M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames>;
}

Assistant:

std::optional<internal::DescriptorNames> CreateDescriptorNames(
      std::initializer_list<absl::string_view> bytes,
      std::initializer_list<size_t> sizes) {
    for (size_t size : sizes) {
      // Name too long.
      if (size != static_cast<uint16_t>(size)) {
        return std::nullopt;
      }
    }

    size_t total_size = 0;
    for (auto b : bytes) total_size += b.size();
    total_size += sizes.size() * sizeof(uint16_t);
    char* out = AllocateArray<char>(total_size);
    for (absl::string_view b : bytes) {
      memcpy(out, b.data(), b.size());
      out += b.size();
    }
    auto res = internal::DescriptorNames(out);
    for (size_t size : sizes) {
      uint16_t size16 = static_cast<uint16_t>(size);
      memcpy(out, &size16, sizeof(size16));
      out += sizeof(size16);
    }
    return res;
  }